

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calculator.cpp
# Opt level: O0

double Calculator::eval(String *e,Dic<double> *vars)

{
  bool bVar1;
  EnumWrapper<const_asl::Dic<double>_> *pEVar2;
  double *pdVar3;
  String *var;
  Dic<double> *e_00;
  bool bVar4;
  double dVar5;
  String *name;
  double value;
  EnumWrapper<asl::Dic<double>_> local_68;
  EnumWrapper<asl::Dic<double>_> *local_50;
  EnumWrapper_ *_b_;
  Calculator calc;
  Dic<double> *vars_local;
  String *e_local;
  
  calc._natfunctions.super_Map<asl::String,_double_(*)(double)>.a._a =
       (Map<asl::String,_double_(*)(double)>)(Map<asl::String,_double_(*)(double)>)vars;
  Calculator((Calculator *)&_b_,e);
  asl::newEnumerator<asl::Dic<double>>
            (&local_68,(asl *)calc._natfunctions.super_Map<asl::String,_double_(*)(double)>.a._a,
             e_00);
  local_50 = &local_68;
  while( true ) {
    pEVar2 = asl::enumData<asl::Dic<double>const>((Dic<double> *)0x0,&local_50->super_EnumWrapper_);
    bVar1 = asl::EnumWrapper::operator_cast_to_bool((EnumWrapper *)pEVar2);
    bVar4 = false;
    if (bVar1) {
      bVar4 = (local_50->super_EnumWrapper_).more != 0;
    }
    if (!bVar4) break;
    pEVar2 = asl::enumData<asl::Dic<double>const>((Dic<double> *)0x0,&local_50->super_EnumWrapper_);
    pdVar3 = asl::Map<asl::String,_double>::Enumerator::operator*((Enumerator *)(pEVar2 + 8));
    dVar5 = *pdVar3;
    while (0 < (local_50->super_EnumWrapper_).more) {
      pEVar2 = asl::enumData<asl::Dic<double>const>
                         ((Dic<double> *)0x0,&local_50->super_EnumWrapper_);
      var = asl::Map<asl::String,_double>::Enumerator::operator~((Enumerator *)(pEVar2 + 8));
      while ((local_50->super_EnumWrapper_).more != 0) {
        set((Calculator *)&_b_,var,dVar5);
        (local_50->super_EnumWrapper_).more = (local_50->super_EnumWrapper_).more + -1;
      }
      (local_50->super_EnumWrapper_).more = (local_50->super_EnumWrapper_).more + -2;
    }
    pEVar2 = asl::enumData<asl::Dic<double>const>((Dic<double> *)0x0,&local_50->super_EnumWrapper_);
    asl::Map<asl::String,_double>::Enumerator::operator++((Enumerator *)(pEVar2 + 8));
    (local_50->super_EnumWrapper_).more = -1 - (local_50->super_EnumWrapper_).more;
  }
  dVar5 = compute((Calculator *)&_b_);
  ~Calculator((Calculator *)&_b_);
  return dVar5;
}

Assistant:

double Calculator::eval(const String& e, const Dic<double>& vars)
{
	Calculator calc(e);
	foreach2(String& name, double value, vars)
		calc.set(name, value);
	return calc.compute();
}